

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

Node * __thiscall Fl_Preferences::Node::childNode(Node *this,int ix)

{
  int iVar1;
  Node *pNVar2;
  
  createIndex(this);
  if ((this->field_0x30 & 4) == 0) {
    iVar1 = nChildren(this);
    iVar1 = ix - iVar1;
    while( true ) {
      iVar1 = iVar1 + 1;
      pNVar2 = this->child_;
      if ((pNVar2 == (Node *)0x0) || (iVar1 == 0)) break;
      this = (Node *)&pNVar2->next_;
    }
  }
  else {
    pNVar2 = this->index_[ix];
  }
  return pNVar2;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::childNode( int ix ) {
  createIndex();
  if (indexed_) {
    // usually faster access in correct order, but needing more memory
    return index_[ix];
  } else {
    // slow access and reverse order
    int n = nChildren();
    ix = n - ix -1;
    Node *nd;
    for ( nd = child_; nd; nd = nd->next_ ) {
      if ( !ix-- ) break;
      if ( !nd ) break;
    }
    return nd;
  }
}